

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fits_hdecompress.c
# Opt level: O2

int qtree_decode64(uchar *infile,LONGLONG *a,int n,int nqx,int nqy,int nbitplanes)

{
  int iVar1;
  uchar *a_00;
  int iVar2;
  int iVar3;
  int iVar4;
  char *err_message;
  int iVar5;
  int iVar6;
  int iVar7;
  int nx;
  int iVar8;
  int ny;
  double dVar9;
  
  iVar6 = nqy;
  if (nqy < nqx) {
    iVar6 = nqx;
  }
  dVar9 = log((double)iVar6);
  iVar2 = (int)(dVar9 / 0.6931471805599453 + 0.5);
  iVar8 = (nqx + 1) / 2;
  iVar5 = (nqy + 1) / 2;
  a_00 = (uchar *)malloc((long)iVar5 * (long)iVar8);
  if (a_00 == (uchar *)0x0) {
    err_message = "qtree_decode64: insufficient memory";
LAB_001b6d9b:
    ffpmsg(err_message);
    iVar6 = 0x19e;
  }
  else {
    iVar2 = (uint)(1 << ((byte)iVar2 & 0x1f) < iVar6) + iVar2;
    while (iVar6 = 1, 0 < nbitplanes) {
      iVar1 = input_nybble(infile);
      if (iVar1 == 0xf) {
        iVar1 = input_huffman(infile);
        *a_00 = (uchar)iVar1;
        iVar1 = 1 << ((byte)iVar2 & 0x1f);
        ny = iVar6;
        nx = iVar6;
        iVar4 = nqy;
        iVar7 = nqx;
        for (; iVar6 < iVar2; iVar6 = iVar6 + 1) {
          iVar1 = iVar1 >> 1;
          iVar3 = iVar1;
          if (iVar7 <= iVar1) {
            iVar3 = 0;
          }
          nx = nx * 2 - (uint)(iVar7 <= iVar1);
          iVar7 = iVar7 - iVar3;
          iVar3 = iVar1;
          if (iVar4 <= iVar1) {
            iVar3 = 0;
          }
          ny = ny * 2 - (uint)(iVar4 <= iVar1);
          iVar4 = iVar4 - iVar3;
          qtree_expand(infile,a_00,nx,ny,a_00);
        }
      }
      else {
        if (iVar1 != 0) {
          err_message = "qtree_decode64: bad format code";
          goto LAB_001b6d9b;
        }
        input_nnybble(infile,iVar5 * iVar8,a_00);
      }
      nbitplanes = nbitplanes + -1;
      qtree_bitins64(a_00,nqx,nqy,a,n,nbitplanes);
    }
    free(a_00);
    iVar6 = 0;
  }
  return iVar6;
}

Assistant:

static int
qtree_decode64(unsigned char *infile, LONGLONG a[], int n, int nqx, int nqy, int nbitplanes)

/*
char *infile;
LONGLONG a[];				 a is 2-D array with dimensions (n,n)	
int n;					 length of full row in a				
int nqx;				 partial length of row to decode		
int nqy;				 partial length of column (<=n)		
int nbitplanes;				 number of bitplanes to decode		
*/
{
int log2n, k, bit, b, nqmax;
int nx,ny,nfx,nfy,c;
int nqx2, nqy2;
unsigned char *scratch;

	/*
	 * log2n is log2 of max(nqx,nqy) rounded up to next power of 2
	 */
	nqmax = (nqx>nqy) ? nqx : nqy;
	log2n = (int) (log((float) nqmax)/log(2.0)+0.5);
	if (nqmax > (1<<log2n)) {
		log2n += 1;
	}
	/*
	 * allocate scratch array for working space
	 */
	nqx2=(nqx+1)/2;
	nqy2=(nqy+1)/2;
	scratch = (unsigned char *) malloc((size_t)nqx2*nqy2);
	if (scratch == (unsigned char *) NULL) {
		ffpmsg("qtree_decode64: insufficient memory");
		return(DATA_DECOMPRESSION_ERR);
	}
	/*
	 * now decode each bit plane, starting at the top
	 * A is assumed to be initialized to zero
	 */
	for (bit = nbitplanes-1; bit >= 0; bit--) {
		/*
		 * Was bitplane was quadtree-coded or written directly?
		 */
		b = input_nybble(infile);

		if(b == 0) {
			/*
			 * bit map was written directly
			 */
			read_bdirect64(infile,a,n,nqx,nqy,scratch,bit);
		} else if (b != 0xf) {
			ffpmsg("qtree_decode64: bad format code");
			return(DATA_DECOMPRESSION_ERR);
		} else {
			/*
			 * bitmap was quadtree-coded, do log2n expansions
			 *
			 * read first code
			 */
			scratch[0] = input_huffman(infile);
			/*
			 * now do log2n expansions, reading codes from file as necessary
			 */
			nx = 1;
			ny = 1;
			nfx = nqx;
			nfy = nqy;
			c = 1<<log2n;
			for (k = 1; k<log2n; k++) {
				/*
				 * this somewhat cryptic code generates the sequence
				 * n[k-1] = (n[k]+1)/2 where n[log2n]=nqx or nqy
				 */
				c = c>>1;
				nx = nx<<1;
				ny = ny<<1;
				if (nfx <= c) { nx -= 1; } else { nfx -= c; }
				if (nfy <= c) { ny -= 1; } else { nfy -= c; }
				qtree_expand(infile,scratch,nx,ny,scratch);
			}
			/*
			 * now copy last set of 4-bit codes to bitplane bit of array a
			 */
			qtree_bitins64(scratch,nqx,nqy,a,n,bit);
		}
	}
	free(scratch);
	return(0);
}